

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj2pbrt.cpp
# Opt level: O0

uint tinyobj::updateVertex
               (map<tinyobj::vertex_index,_unsigned_int,_std::less<tinyobj::vertex_index>,_std::allocator<std::pair<const_tinyobj::vertex_index,_unsigned_int>_>_>
                *vertexCache,vector<float,_std::allocator<float>_> *positions,
               vector<float,_std::allocator<float>_> *normals,
               vector<float,_std::allocator<float>_> *texcoords,
               vector<float,_std::allocator<float>_> *in_positions,
               vector<float,_std::allocator<float>_> *in_normals,
               vector<float,_std::allocator<float>_> *in_texcoords,vertex_index *i)

{
  int iVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  uint uVar4;
  pointer ppVar5;
  size_type sVar6;
  vector<float,_std::allocator<float>_> *this;
  vector<float,_std::allocator<float>_> *pvVar7;
  mapped_type_conflict *pmVar8;
  value_type_conflict3 *in_RCX;
  key_type *in_RSI;
  vector<float,_std::allocator<float>_> *in_R8;
  vector<float,_std::allocator<float>_> *in_R9;
  vector<float,_std::allocator<float>_> *in_stack_00000008;
  int *in_stack_00000010;
  uint idx;
  iterator it;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  uint uVar9;
  _Rb_tree_iterator<std::pair<const_tinyobj::vertex_index,_unsigned_int>_>
  *in_stack_ffffffffffffff60;
  value_type_conflict3 *in_stack_ffffffffffffff68;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffff70;
  key_type *__k;
  key_type *this_00;
  _Self local_48;
  _Self local_40;
  vector<float,_std::allocator<float>_> *local_38;
  vector<float,_std::allocator<float>_> *local_30;
  value_type_conflict3 *local_28;
  key_type *local_18;
  uint local_4;
  
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_18 = in_RSI;
  local_40._M_node =
       (_Base_ptr)
       std::
       map<tinyobj::vertex_index,_unsigned_int,_std::less<tinyobj::vertex_index>,_std::allocator<std::pair<const_tinyobj::vertex_index,_unsigned_int>_>_>
       ::find((map<tinyobj::vertex_index,_unsigned_int,_std::less<tinyobj::vertex_index>,_std::allocator<std::pair<const_tinyobj::vertex_index,_unsigned_int>_>_>
               *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),(key_type *)0x12d716)
  ;
  local_48._M_node =
       (_Base_ptr)
       std::
       map<tinyobj::vertex_index,_unsigned_int,_std::less<tinyobj::vertex_index>,_std::allocator<std::pair<const_tinyobj::vertex_index,_unsigned_int>_>_>
       ::end((map<tinyobj::vertex_index,_unsigned_int,_std::less<tinyobj::vertex_index>,_std::allocator<std::pair<const_tinyobj::vertex_index,_unsigned_int>_>_>
              *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  bVar3 = std::operator!=(&local_40,&local_48);
  if (bVar3) {
    ppVar5 = std::_Rb_tree_iterator<std::pair<const_tinyobj::vertex_index,_unsigned_int>_>::
             operator->(in_stack_ffffffffffffff60);
    local_4 = ppVar5->second;
  }
  else {
    __k = local_18;
    std::vector<float,_std::allocator<float>_>::operator[](local_30,(long)*in_stack_00000010 * 3);
    std::vector<float,_std::allocator<float>_>::push_back
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    this_00 = local_18;
    std::vector<float,_std::allocator<float>_>::operator[]
              (local_30,(long)*in_stack_00000010 * 3 + 1);
    std::vector<float,_std::allocator<float>_>::push_back
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    std::vector<float,_std::allocator<float>_>::operator[]
              (local_30,(long)*in_stack_00000010 * 3 + 2);
    std::vector<float,_std::allocator<float>_>::push_back
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    if (-1 < in_stack_00000010[2]) {
      iVar1 = in_stack_00000010[2];
      sVar6 = std::vector<float,_std::allocator<float>_>::size(local_38);
      if ((ulong)(long)(iVar1 * 3 + 2) < sVar6) {
        std::vector<float,_std::allocator<float>_>::operator[]
                  (local_38,(long)in_stack_00000010[2] * 3);
        std::vector<float,_std::allocator<float>_>::push_back
                  (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
        std::vector<float,_std::allocator<float>_>::operator[]
                  (local_38,(long)in_stack_00000010[2] * 3 + 1);
        std::vector<float,_std::allocator<float>_>::push_back
                  (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
        std::vector<float,_std::allocator<float>_>::operator[]
                  (local_38,(long)in_stack_00000010[2] * 3 + 2);
        std::vector<float,_std::allocator<float>_>::push_back
                  (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      }
    }
    if (-1 < in_stack_00000010[1]) {
      this = (vector<float,_std::allocator<float>_> *)(long)(in_stack_00000010[1] * 2 + 1);
      pvVar7 = (vector<float,_std::allocator<float>_> *)
               std::vector<float,_std::allocator<float>_>::size(in_stack_00000008);
      if (this < pvVar7) {
        std::vector<float,_std::allocator<float>_>::operator[]
                  (in_stack_00000008,(long)in_stack_00000010[1] * 2);
        std::vector<float,_std::allocator<float>_>::push_back(this,in_stack_ffffffffffffff68);
        std::vector<float,_std::allocator<float>_>::operator[]
                  (in_stack_00000008,(long)in_stack_00000010[1] * 2 + 1);
        std::vector<float,_std::allocator<float>_>::push_back(this,local_28);
      }
    }
    sVar6 = std::vector<float,_std::allocator<float>_>::size
                      ((vector<float,_std::allocator<float>_> *)local_18);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = sVar6;
    uVar4 = SUB164(auVar2 / ZEXT816(3),0) - 1;
    uVar9 = uVar4;
    pmVar8 = std::
             map<tinyobj::vertex_index,_unsigned_int,_std::less<tinyobj::vertex_index>,_std::allocator<std::pair<const_tinyobj::vertex_index,_unsigned_int>_>_>
             ::operator[]((map<tinyobj::vertex_index,_unsigned_int,_std::less<tinyobj::vertex_index>,_std::allocator<std::pair<const_tinyobj::vertex_index,_unsigned_int>_>_>
                           *)this_00,__k);
    *pmVar8 = uVar9;
    local_4 = uVar4;
  }
  return local_4;
}

Assistant:

static unsigned int
updateVertex(std::map<vertex_index, unsigned int> &vertexCache,
             std::vector<float> &positions, std::vector<float> &normals,
             std::vector<float> &texcoords,
             const std::vector<float> &in_positions,
             const std::vector<float> &in_normals,
             const std::vector<float> &in_texcoords, const vertex_index &i) {
  const std::map<vertex_index, unsigned int>::iterator it = vertexCache.find(i);

  if (it != vertexCache.end()) {
    // found cache
    return it->second;
  }

  assert(in_positions.size() > static_cast<unsigned int>(3 * i.v_idx + 2));

  positions.push_back(in_positions[3 * static_cast<size_t>(i.v_idx) + 0]);
  positions.push_back(in_positions[3 * static_cast<size_t>(i.v_idx) + 1]);
  positions.push_back(in_positions[3 * static_cast<size_t>(i.v_idx) + 2]);

  if ((i.vn_idx >= 0) &&
      (static_cast<size_t>(i.vn_idx * 3 + 2) < in_normals.size())) {
    normals.push_back(in_normals[3 * static_cast<size_t>(i.vn_idx) + 0]);
    normals.push_back(in_normals[3 * static_cast<size_t>(i.vn_idx) + 1]);
    normals.push_back(in_normals[3 * static_cast<size_t>(i.vn_idx) + 2]);
  }

  if ((i.vt_idx >= 0) &&
      (static_cast<size_t>(i.vt_idx * 2 + 1) < in_texcoords.size())) {
    texcoords.push_back(in_texcoords[2 * static_cast<size_t>(i.vt_idx) + 0]);
    texcoords.push_back(in_texcoords[2 * static_cast<size_t>(i.vt_idx) + 1]);
  }

  unsigned int idx = static_cast<unsigned int>(positions.size() / 3 - 1);
  vertexCache[i] = idx;

  return idx;
}